

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void ImageAlphaMask(Image *image,Image alphaMask)

{
  void *__ptr;
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  int i;
  ulong uVar4;
  char *text;
  uint uVar5;
  long lVar6;
  Image mask;
  
  if ((image->width != alphaMask.width) || (image->height != alphaMask.height)) {
    text = "IMAGE: Alpha mask must be same size as image";
LAB_00137013:
    TraceLog(4,text);
    return;
  }
  if (10 < image->format) {
    text = "IMAGE: Alpha mask can not be applied to compressed data formats";
    goto LAB_00137013;
  }
  ImageCopy(alphaMask);
  if (mask.format != 1) {
    ImageFormat(&mask,1);
  }
  if (image->format != 7) {
    if (image->format == 1) {
      lVar6 = (long)image->height * (long)image->width;
      pvVar2 = malloc(lVar6 * 2);
      uVar5 = (uint)lVar6;
      uVar1 = mask.height * mask.width;
      if (mask.height * mask.width <= (int)uVar5) {
        uVar1 = uVar5;
      }
      uVar4 = 0;
      uVar3 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar3 = uVar4;
      }
      __ptr = image->data;
      for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        *(undefined1 *)((long)pvVar2 + uVar4 * 2) = *(undefined1 *)((long)__ptr + uVar4);
        *(undefined1 *)((long)pvVar2 + uVar4 * 2 + 1) = *(undefined1 *)((long)mask.data + uVar4);
      }
      free(__ptr);
      image->data = pvVar2;
      image->format = 2;
      goto LAB_001370cc;
    }
    ImageFormat(image,7);
  }
  for (lVar6 = 0;
      (lVar6 < (long)mask.height * (long)mask.width ||
      (lVar6 < (long)image->height * (long)image->width)); lVar6 = lVar6 + 1) {
    *(undefined1 *)((long)image->data + lVar6 * 4 + 3) = *(undefined1 *)((long)mask.data + lVar6);
  }
LAB_001370cc:
  free(mask.data);
  return;
}

Assistant:

void ImageAlphaMask(Image *image, Image alphaMask)
{
    if ((image->width != alphaMask.width) || (image->height != alphaMask.height))
    {
        TRACELOG(LOG_WARNING, "IMAGE: Alpha mask must be same size as image");
    }
    else if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB)
    {
        TRACELOG(LOG_WARNING, "IMAGE: Alpha mask can not be applied to compressed data formats");
    }
    else
    {
        // Force mask to be Grayscale
        Image mask = ImageCopy(alphaMask);
        if (mask.format != PIXELFORMAT_UNCOMPRESSED_GRAYSCALE) ImageFormat(&mask, PIXELFORMAT_UNCOMPRESSED_GRAYSCALE);

        // In case image is only grayscale, we just add alpha channel
        if (image->format == PIXELFORMAT_UNCOMPRESSED_GRAYSCALE)
        {
            unsigned char *data = (unsigned char *)RL_MALLOC(image->width*image->height*2);

            // Apply alpha mask to alpha channel
            for (int i = 0, k = 0; (i < mask.width*mask.height) || (i < image->width*image->height); i++, k += 2)
            {
                data[k] = ((unsigned char *)image->data)[i];
                data[k + 1] = ((unsigned char *)mask.data)[i];
            }

            RL_FREE(image->data);
            image->data = data;
            image->format = PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA;
        }
        else
        {
            // Convert image to RGBA
            if (image->format != PIXELFORMAT_UNCOMPRESSED_R8G8B8A8) ImageFormat(image, PIXELFORMAT_UNCOMPRESSED_R8G8B8A8);

            // Apply alpha mask to alpha channel
            for (int i = 0, k = 3; (i < mask.width*mask.height) || (i < image->width*image->height); i++, k += 4)
            {
                ((unsigned char *)image->data)[k] = ((unsigned char *)mask.data)[i];
            }
        }

        UnloadImage(mask);
    }
}